

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarRequest.c
# Opt level: O2

int UpnpStateVarRequest_assign(UpnpStateVarRequest *p,UpnpStateVarRequest *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  sockaddr_storage *psVar10;
  sockaddr_storage *psVar11;
  byte bVar12;
  
  bVar12 = 0;
  if (p == q) {
    iVar8 = 1;
  }
  else {
    iVar8 = q->m_Socket;
    p->m_ErrCode = q->m_ErrCode;
    p->m_Socket = iVar8;
    iVar7 = UpnpStateVarRequest_set_ErrStr(p,q->m_ErrStr);
    iVar8 = 0;
    if (iVar7 != 0) {
      iVar7 = UpnpStateVarRequest_set_DevUDN(p,q->m_DevUDN);
      if (iVar7 != 0) {
        iVar7 = UpnpStateVarRequest_set_ServiceID(p,q->m_ServiceID);
        iVar8 = 0;
        if (iVar7 != 0) {
          iVar7 = UpnpStateVarRequest_set_StateVarName(p,q->m_StateVarName);
          if (iVar7 != 0) {
            psVar10 = &q->m_CtrlPtIPAddr;
            psVar11 = &p->m_CtrlPtIPAddr;
            for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
              cVar1 = psVar10->__ss_padding[0];
              cVar2 = psVar10->__ss_padding[1];
              cVar3 = psVar10->__ss_padding[2];
              cVar4 = psVar10->__ss_padding[3];
              cVar5 = psVar10->__ss_padding[4];
              cVar6 = psVar10->__ss_padding[5];
              psVar11->ss_family = psVar10->ss_family;
              psVar11->__ss_padding[0] = cVar1;
              psVar11->__ss_padding[1] = cVar2;
              psVar11->__ss_padding[2] = cVar3;
              psVar11->__ss_padding[3] = cVar4;
              psVar11->__ss_padding[4] = cVar5;
              psVar11->__ss_padding[5] = cVar6;
              psVar10 = (sockaddr_storage *)((long)psVar10 + (ulong)bVar12 * -0x10 + 8);
              psVar11 = (sockaddr_storage *)((long)psVar11 + (ulong)bVar12 * -0x10 + 8);
            }
            iVar8 = UpnpStateVarRequest_set_CurrentVal(p,q->m_CurrentVal);
            return iVar8;
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int UpnpStateVarRequest_assign(
	UpnpStateVarRequest *p, const UpnpStateVarRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpStateVarRequest_set_ErrCode(
				   p, UpnpStateVarRequest_get_ErrCode(q));
		ok = ok && UpnpStateVarRequest_set_Socket(
				   p, UpnpStateVarRequest_get_Socket(q));
		ok = ok && UpnpStateVarRequest_set_ErrStr(
				   p, UpnpStateVarRequest_get_ErrStr(q));
		ok = ok && UpnpStateVarRequest_set_DevUDN(
				   p, UpnpStateVarRequest_get_DevUDN(q));
		ok = ok && UpnpStateVarRequest_set_ServiceID(
				   p, UpnpStateVarRequest_get_ServiceID(q));
		ok = ok && UpnpStateVarRequest_set_StateVarName(
				   p, UpnpStateVarRequest_get_StateVarName(q));
		ok = ok && UpnpStateVarRequest_set_CtrlPtIPAddr(
				   p, UpnpStateVarRequest_get_CtrlPtIPAddr(q));
		ok = ok && UpnpStateVarRequest_set_CurrentVal(
				   p, UpnpStateVarRequest_get_CurrentVal(q));
	}

	return ok;
}